

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

LpStats * __thiscall Clasp::ClaspFacade::Summary::lpStep(Summary *this)

{
  ulong uVar1;
  LpStats *pLVar2;
  
  uVar1 = (this->facade->builder_).ptr_;
  pLVar2 = (LpStats *)((uVar1 & 0xfffffffffffffffe) + 0x1c);
  if (this->facade->type_ != Asp) {
    pLVar2 = (LpStats *)0x0;
  }
  if (uVar1 < 2) {
    pLVar2 = (LpStats *)0x0;
  }
  return pLVar2;
}

Assistant:

const Asp::LpStats* ClaspFacade::Summary::lpStep() const {
	return facade->isAsp() ? &static_cast<const Asp::LogicProgram*>(facade->program())->stats : 0;
}